

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

Float __thiscall
pbrt::DielectricInterfaceBxDF::PDF
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  bool bVar2;
  Vector3f wm;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Float FVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [64];
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar7 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  Vector3<float> VVar23;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wm_00;
  Vector3<float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 extraout_var [60];
  undefined1 auVar21 [60];
  
  local_98.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._8_56_ = wi._8_56_;
  auVar22._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._8_56_ = wo._8_56_;
  auVar8._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_98._0_8_ = vmovlps_avx(auVar22._0_16_);
  local_88 = auVar8._0_16_;
  auVar16 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  if (auVar16._0_4_ < 0.001) {
    return 0.0;
  }
  local_78 = vmovshdup_avx(local_88);
  if (wo_00.super_Tuple3<pbrt::Vector3,_float>.z * local_98.z <= 0.0) {
    if ((sampleFlags & Transmission) == Unset) {
      return 0.0;
    }
    uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x20,
                           ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),1);
    bVar2 = (bool)((byte)uVar1 & 1);
    local_68._0_4_ = (uint)bVar2 * (int)this->eta + (uint)!bVar2 * (int)(1.0 / this->eta);
    local_68._4_12_ = SUB6012((undefined1  [60])0x0,0);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)local_68._0_4_ * local_98.z + wo_00.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_4_ =
         (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x +
         wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar16._4_4_ =
         (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y +
         wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar16._8_4_ =
         (float)local_68._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z +
         wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._12_4_ = (float)local_68._0_4_ * wi._12_4_ + wo._12_4_;
    uVar1 = vmovlps_avx(auVar16);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar3 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg,CONCAT44(in_register_00000034,mode)), iVar3 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x70) = *(long *)(in_FS_OFFSET + -0x70) + 1;
    auVar17._0_4_ =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
         local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar17._4_4_ =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z *
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._8_8_ = 0;
    auVar16 = vmovshdup_avx(auVar17);
    auVar21 = ZEXT1260(auVar16._4_12_);
    fVar5 = local_a8.super_Tuple3<pbrt::Vector3,_float>.x *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.x + auVar17._0_4_ + auVar16._0_4_;
    auVar14 = (undefined1  [56])0x0;
    if ((fVar5 == 0.0) && (!NAN(fVar5))) {
      *(long *)(in_FS_OFFSET + -0x78) = *(long *)(in_FS_OFFSET + -0x78) + 1;
      return 0.0;
    }
    VVar23 = Normalize<float>(&local_a8);
    auVar19._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._4_60_ = auVar21;
    auVar11._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar14;
    auVar7 = auVar11._0_16_;
    auVar16 = vmovshdup_avx(auVar7);
    uVar1 = vmovlps_avx(auVar7);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * local_98.y)),auVar7,
                              ZEXT416((uint)local_98.x));
    auVar17 = vfmadd231ss_fma(auVar17,auVar19._0_16_,ZEXT416((uint)local_98.z));
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * (float)local_78._0_4_)),local_88,auVar7
                             );
    auVar14 = ZEXT856(0);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),
                              auVar19._0_16_);
    auVar21 = (undefined1  [60])0x0;
    if (0.0 < auVar17._0_4_ * auVar16._0_4_) {
      return 0.0;
    }
    local_30.x = 0.0;
    local_30.y = 0.0;
    local_30.z = 1.0;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z = auVar19._0_4_;
    VVar23 = FaceForward<float>(&local_a8,(Normal3<float> *)&local_30);
    auVar20._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._4_60_ = auVar21;
    auVar12._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar14;
    auVar7._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.x * local_88._0_4_;
    auVar7._4_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.y * local_88._4_4_;
    auVar7._8_4_ = auVar14._0_4_ * local_88._8_4_;
    auVar7._12_4_ = auVar14._4_4_ * local_88._12_4_;
    auVar16 = vmovshdup_avx(auVar7);
    auVar16 = vfmadd231ss_fma(auVar16,local_88,auVar12._0_16_);
    auVar16 = vfmadd231ss_fma(auVar16,auVar20._0_16_,
                              ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar13._0_4_ = FrDielectric(auVar16._0_4_,this->eta);
    auVar13._4_60_ = extraout_var;
    local_58 = auVar13._0_16_;
    local_48._0_4_ = 1.0 - auVar13._0_4_;
    if (((float)local_48._0_4_ == 0.0) && (!NAN((float)local_48._0_4_))) {
      return 0.0;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar3 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar3 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x60) = *(long *)(in_FS_OFFSET + -0x60) + 1;
    local_58._0_4_ = (uint)((byte)sampleFlags & 1) * local_58._0_4_;
    fVar5 = AbsDot<float>((Vector3<float> *)&local_98,&local_a8);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
                                            local_98.y)),
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_98.x));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_98.z));
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
                                            (float)local_78._0_4_)),local_88,
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar16 = vfmadd132ss_fma(auVar16,auVar17,ZEXT416((uint)local_68._0_4_));
    wm_00.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78._0_4_ = fVar5 / (auVar16._0_4_ * auVar16._0_4_);
    wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_88._0_8_;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = wo_00.super_Tuple3<pbrt::Vector3,_float>.z;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
    FVar4 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo_01,wm_00);
    fVar5 = (float)local_48._0_4_ * FVar4 * (float)local_78._0_4_;
    local_68._0_4_ = (float)local_48._0_4_ + (float)local_58._0_4_;
  }
  else {
    if ((sampleFlags & Reflection) == Unset) {
      return 0.0;
    }
    auVar6._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.x + wi.super_Tuple3<pbrt::Vector3,_float>.x
    ;
    auVar6._4_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.y + wi.super_Tuple3<pbrt::Vector3,_float>.y
    ;
    auVar6._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z + wi.super_Tuple3<pbrt::Vector3,_float>.z
    ;
    auVar6._12_4_ = wo._12_4_ + wi._12_4_;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         wo_00.super_Tuple3<pbrt::Vector3,_float>.z + local_98.z;
    uVar1 = vmovlps_avx(auVar6);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar3 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg,CONCAT44(in_register_00000034,mode)), iVar3 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0xa0) = *(long *)(in_FS_OFFSET + -0xa0) + 1;
    auVar15._0_4_ =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
         local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar15._4_4_ =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z *
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._8_8_ = 0;
    auVar16 = vmovshdup_avx(auVar15);
    fVar5 = local_a8.super_Tuple3<pbrt::Vector3,_float>.x *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.x + auVar15._0_4_ + auVar16._0_4_;
    if ((fVar5 == 0.0) && (!NAN(fVar5))) {
      *(long *)(in_FS_OFFSET + -0xa8) = *(long *)(in_FS_OFFSET + -0xa8) + 1;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar3 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar3 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x90) = *(long *)(in_FS_OFFSET + -0x90) + 1;
    auVar14 = ZEXT856(0);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
                                            (float)local_78._0_4_)),
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_88._0_4_));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar21 = ZEXT1260(auVar16._4_12_);
    if (auVar16._0_4_ < 0.0) {
      *(long *)(in_FS_OFFSET + -0x98) = *(long *)(in_FS_OFFSET + -0x98) + 1;
    }
    fVar5 = local_a8.super_Tuple3<pbrt::Vector3,_float>.x *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.x +
            local_a8.super_Tuple3<pbrt::Vector3,_float>.y *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.y +
            local_a8.super_Tuple3<pbrt::Vector3,_float>.z *
            local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
    if ((fVar5 == 0.0) && (!NAN(fVar5))) {
      return 0.0;
    }
    if (auVar16._0_4_ <= 0.0) {
      return 0.0;
    }
    VVar23 = Normalize<float>(&local_a8);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar14;
    uVar1 = vmovlps_avx(auVar9._0_16_);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_a8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    local_30.x = 0.0;
    local_30.y = 0.0;
    local_30.z = 1.0;
    VVar23 = FaceForward<float>(&local_a8,(Vector3<float> *)&local_30);
    auVar18._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._4_60_ = auVar21;
    auVar10._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar14;
    auVar16 = vmovshdup_avx(auVar10._0_16_);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * local_98.y)),auVar10._0_16_,
                              ZEXT416((uint)local_98.x));
    auVar16 = vfmadd231ss_fma(auVar16,auVar18._0_16_,ZEXT416((uint)local_98.z));
    local_68._0_4_ = FrDielectric(auVar16._0_4_,this->eta);
    FVar4 = (Float)local_68._0_4_;
    if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
        ::reg == '\0') {
      iVar3 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                   ::reg);
      FVar4 = (Float)local_68._0_4_;
      if (iVar3 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                    ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                          ::StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                             ::reg);
        FVar4 = (Float)local_68._0_4_;
      }
    }
    auVar16 = local_88;
    *(long *)(in_FS_OFFSET + -0x80) = *(long *)(in_FS_OFFSET + -0x80) + 1;
    if ((FVar4 == 0.0) && (!NAN(FVar4))) {
      *(long *)(in_FS_OFFSET + -0x88) = *(long *)(in_FS_OFFSET + -0x88) + 1;
    }
    wm.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    wm.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
    wm.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
    local_48 = ZEXT416((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - FVar4));
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_88._0_4_;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_88._4_4_;
    local_88 = auVar16;
    FVar4 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo_00,wm);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._0_4_ *
                                            local_a8.super_Tuple3<pbrt::Vector3,_float>.y)),local_88
                              ,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
    fVar5 = (float)local_68._0_4_ * (FVar4 / (auVar16._0_4_ * 4.0));
    local_68._0_4_ = (float)local_68._0_4_ + (float)local_48._0_4_;
  }
  return fVar5 / (float)local_68._0_4_;
}

Assistant:

Float DielectricInterfaceBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                                   BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth())
        return 0;
    // Return PDF for non-delta dielectric interface
    if (SameHemisphere(wo, wi)) {
        // Return PDF for non-delta dielectric reflection
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        // Compute half-angle vector _wh_ for dielectric reflection PDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);

        // Compute Fresnel factor and probabilities for dielectric reflection PDF
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        CHECK_RARE(1e-5f, F == 0);
        Float pr = F, pt = 1 - F;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;

        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);

    } else {
        // Return PDF for non-delta dielectric transmission
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            return 0;
        // Compute $\wh$ for dielectric transmission PDF
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return 0;
        wh = Normalize(wh);
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return 0.;

        // Compute Fresnel factor and probabilities for dielectric transmission PDF
        Float F = FrDielectric(Dot(wo, FaceForward(wh, Normal3f(0, 0, 1))), eta);
        Float pr = F, pt = 1 - F;
        if (pt == 0)
            return 0;
        CHECK_RARE(1e-5f, (1 - F) == 0);
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;

        Float dwh_dwi = AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
        return mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
    }
}